

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall IR::Opnd::SetValueType(Opnd *this,ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  ObjectType OVar4;
  RegOpnd *this_00;
  undefined4 *puVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType_local;
  
  if ((this->field_0xb & 1) != 0) {
    return;
  }
  local_1a[0] = valueType.field_0;
  if (this->m_kind == OpndKindReg) {
    this_00 = AsRegOpnd(this);
    bVar2 = RegOpnd::IsArrayRegOpnd(this_00);
    if (bVar2) {
      bVar2 = ValueType::IsObject((ValueType *)&local_1a[0].field_0);
      if (bVar2) {
        OVar3 = ValueType::GetObjectType((ValueType *)&local_1a[0].field_0);
        OVar4 = ValueType::GetObjectType(&this->m_valueType);
        if (OVar3 == OVar4) goto LAB_005a7596;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                         ,0x200,
                         "(!IsRegOpnd() || !AsRegOpnd()->IsArrayRegOpnd() || valueType.IsObject() && valueType.GetObjectType() == m_valueType.GetObjectType())"
                         ,
                         "!IsRegOpnd() || !AsRegOpnd()->IsArrayRegOpnd() || valueType.IsObject() && valueType.GetObjectType() == m_valueType.GetObjectType()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
LAB_005a7596:
  (this->m_valueType).field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_1a[0];
  return;
}

Assistant:

void Opnd::SetValueType(const ValueType valueType)
{
    if(m_isValueTypeFixed)
    {
        return;
    }

    // ArrayRegOpnd has information specific to the array type, so make sure that doesn't change
    Assert(
        !IsRegOpnd() ||
        !AsRegOpnd()->IsArrayRegOpnd() ||
        valueType.IsObject() && valueType.GetObjectType() == m_valueType.GetObjectType());

    m_valueType = valueType;
}